

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_tree(REF_INTERP ref_interp,REF_BOOL *increase_fuzz)

{
  uint cell;
  int node;
  int iVar1;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_SEARCH pRVar4;
  REF_CELL pRVar5;
  REF_GLOB *pRVar6;
  REF_DBL *pRVar7;
  REF_MPI pRVar8;
  uint uVar9;
  REF_STATUS RVar10;
  uint uVar11;
  uint uVar12;
  void *pvVar13;
  double *pdVar14;
  int *piVar15;
  REF_INT *pRVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  undefined8 uVar20;
  long lVar21;
  char *pcVar22;
  REF_INT RVar23;
  size_t sVar24;
  double dVar25;
  REF_DBL RVar26;
  REF_INT total_node;
  REF_INTERP local_1a0;
  REF_MPI local_198;
  double *local_190;
  int *local_188;
  void *local_180;
  void *local_178;
  REF_INT *local_170;
  REF_SEARCH local_168;
  REF_NODE local_160;
  REF_DBL *global_xyz;
  REF_INT nrecv;
  REF_NODE local_148;
  REF_INT *source;
  REF_LIST ref_list;
  double *local_130;
  int *local_128;
  void *local_120;
  int *local_118;
  void *local_110;
  REF_GRID local_108;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  local_198 = ref_interp->ref_mpi;
  pRVar2 = ref_interp->from_grid;
  local_160 = pRVar2->node;
  pRVar3 = ref_interp->to_grid->node;
  pRVar4 = ref_interp->ref_search;
  pRVar5 = (&ref_interp->from_tet)[pRVar2->twod != 0];
  *increase_fuzz = 0;
  uVar9 = ref_list_create(&ref_list);
  if (uVar9 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x49b,
           "ref_interp_tree",(ulong)uVar9,"create list");
    return uVar9;
  }
  if ((long)pRVar3->max < 1) {
    uVar9 = 0;
  }
  else {
    lVar18 = 0;
    uVar9 = 0;
    do {
      if ((-1 < pRVar3->global[lVar18]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar18])) {
        uVar9 = uVar9 + (ref_interp->cell[lVar18] == -1);
      }
      lVar18 = lVar18 + 1;
    } while (pRVar3->max != lVar18);
  }
  local_1a0 = ref_interp;
  local_168 = pRVar4;
  local_108 = pRVar2;
  local_d0 = pRVar5;
  if ((int)uVar9 < 0) {
    pcVar22 = "malloc local_node of REF_INT negative";
    uVar20 = 0x4a3;
LAB_00159a08:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar20
           ,"ref_interp_tree",pcVar22);
    RVar10 = 1;
  }
  else {
    local_148 = pRVar3;
    pvVar13 = malloc((ulong)uVar9 << 2);
    if (pvVar13 == (void *)0x0) {
      pcVar22 = "malloc local_node of REF_INT NULL";
      uVar20 = 0x4a3;
    }
    else {
      local_110 = pvVar13;
      pvVar13 = malloc((ulong)(uVar9 * 3) << 3);
      if (pvVar13 == (void *)0x0) {
        pcVar22 = "malloc local_xyz of REF_DBL NULL";
        uVar20 = 0x4a4;
      }
      else {
        if (local_148->max < 1) {
          RVar23 = 0;
        }
        else {
          pRVar6 = local_148->global;
          lVar18 = 0;
          lVar19 = 2;
          RVar23 = 0;
          do {
            if (((-1 < pRVar6[lVar18]) && (local_148->ref_mpi->id == local_148->part[lVar18])) &&
               (ref_interp->cell[lVar18] == -1)) {
              *(int *)((long)local_110 + (long)RVar23 * 4) = (int)lVar18;
              pRVar7 = local_148->real;
              lVar21 = (long)(RVar23 * 3);
              *(REF_DBL *)((long)pvVar13 + lVar21 * 8) = pRVar7[lVar19 + -2];
              *(REF_DBL *)((long)pvVar13 + lVar21 * 8 + 8) = pRVar7[lVar19 + -1];
              *(REF_DBL *)((long)pvVar13 + lVar21 * 8 + 0x10) = pRVar7[lVar19];
              RVar23 = RVar23 + 1;
            }
            lVar18 = lVar18 + 1;
            lVar19 = lVar19 + 0xf;
          } while (lVar18 < local_148->max);
        }
        local_118 = increase_fuzz;
        local_d8 = pvVar13;
        uVar9 = ref_mpi_allconcat(local_198,3,RVar23,pvVar13,&total_node,&source,&global_xyz,3);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x4b1,"ref_interp_tree",(ulong)uVar9,"cat");
          return uVar9;
        }
        if (source != (REF_INT *)0x0) {
          free(source);
        }
        uVar9 = ref_mpi_allconcat(local_198,1,RVar23,local_110,&total_node,&source,&global_node,1);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x4b5,"ref_interp_tree",(ulong)uVar9,"cat");
          return uVar9;
        }
        lVar18 = (long)total_node;
        if (lVar18 < 0) {
          pcVar22 = "malloc best_bary of REF_DBL negative";
          uVar20 = 0x4b7;
          goto LAB_00159a08;
        }
        pdVar14 = (double *)malloc(lVar18 * 8);
        if (pdVar14 == (double *)0x0) {
          pcVar22 = "malloc best_bary of REF_DBL NULL";
          uVar20 = 0x4b7;
        }
        else {
          sVar24 = lVar18 << 2;
          local_120 = malloc(sVar24);
          if (local_120 == (void *)0x0) {
            pcVar22 = "malloc best_node of REF_INT NULL";
            uVar20 = 0x4b8;
          }
          else {
            piVar15 = (int *)malloc(sVar24);
            if (piVar15 == (int *)0x0) {
              pcVar22 = "malloc best_cell of REF_INT NULL";
              uVar20 = 0x4b9;
            }
            else {
              local_128 = piVar15;
              pRVar16 = (REF_INT *)malloc(sVar24);
              if (pRVar16 == (REF_INT *)0x0) {
                pcVar22 = "malloc from_proc of REF_INT NULL";
                uVar20 = 0x4ba;
              }
              else {
                uVar9 = 0;
                local_170 = pRVar16;
                local_130 = pdVar14;
                if (0 < total_node) {
                  pvVar13 = (void *)0x0;
                  lVar18 = 0;
                  piVar15 = local_128;
                  do {
                    *(REF_INT *)((long)local_120 + lVar18 * 4) = global_node[lVar18];
                    *piVar15 = -1;
                    *pdVar14 = 1e+20;
                    local_190 = pdVar14;
                    local_188 = piVar15;
                    local_180 = pvVar13;
                    uVar11 = ref_search_touching(local_168,ref_list,
                                                 (REF_DBL *)((long)global_xyz + (long)pvVar13),
                                                 ref_interp->search_fuzz);
                    if (uVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x4c1,"ref_interp_tree",(ulong)uVar11,"tch");
                      return uVar11;
                    }
                    if (ref_list->n < 1) {
                      *local_188 = -1;
                    }
                    else {
                      if (pRVar2->twod == 0) {
                        uVar11 = ref_interp_enclosing_tet_in_list
                                           (ref_interp,ref_list,
                                            (REF_DBL *)((long)global_xyz + (long)local_180),
                                            local_188,bary);
                        if (uVar11 != 0) {
                          uVar20 = 0x4cc;
                          goto LAB_00159d32;
                        }
                      }
                      else {
                        uVar11 = ref_interp_enclosing_tri_in_list
                                           (ref_interp,ref_list,
                                            (REF_DBL *)((long)global_xyz + (long)local_180),
                                            local_188,bary);
                        if (uVar11 != 0) {
                          uVar20 = 0x4c7;
LAB_00159d32:
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,uVar20,"ref_interp_tree",(ulong)uVar11,"best in list");
                          uVar9 = uVar11;
                        }
                      }
                      if (uVar11 != 0) {
                        return uVar9;
                      }
                      if (*local_188 != -1) {
                        dVar25 = bary[0];
                        if (bary[1] <= bary[0]) {
                          dVar25 = bary[1];
                        }
                        RVar26 = bary[2];
                        if (bary[3] <= bary[2]) {
                          RVar26 = bary[3];
                        }
                        if (RVar26 <= dVar25) {
                          dVar25 = RVar26;
                        }
                        *local_190 = -dVar25;
                      }
                    }
                    ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                    uVar11 = ref_list_erase(ref_list);
                    if (uVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x4d6,"ref_interp_tree",(ulong)uVar11,"reset list");
                      return uVar11;
                    }
                    lVar18 = lVar18 + 1;
                    pvVar13 = (void *)((long)local_180 + 0x18);
                    pdVar14 = local_190 + 1;
                    piVar15 = local_188 + 1;
                  } while (lVar18 < total_node);
                }
                pRVar8 = local_198;
                uVar11 = ref_mpi_allminwho(local_198,local_130,local_170,total_node);
                if (uVar11 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x4da,"ref_interp_tree",(ulong)uVar11,"who");
                  return uVar11;
                }
                if ((long)total_node < 1) {
                  uVar11 = 0;
                }
                else {
                  lVar18 = 0;
                  uVar11 = 0;
                  do {
                    uVar11 = uVar11 + (pRVar8->id == local_170[lVar18]);
                    lVar18 = lVar18 + 1;
                  } while (total_node != lVar18);
                }
                if ((int)uVar11 < 0) {
                  pcVar22 = "malloc send_bary of REF_DBL negative";
                  uVar20 = 0x4e0;
                  goto LAB_00159a08;
                }
                pvVar13 = malloc((ulong)(uVar11 * 4) << 3);
                if (pvVar13 == (void *)0x0) {
                  pcVar22 = "malloc send_bary of REF_DBL NULL";
                  uVar20 = 0x4e0;
                }
                else {
                  sVar24 = (ulong)uVar11 * 4;
                  local_180 = pvVar13;
                  local_168 = (REF_SEARCH)malloc(sVar24);
                  if (local_168 == (REF_SEARCH)0x0) {
                    pcVar22 = "malloc send_cell of REF_INT NULL";
                    uVar20 = 0x4e1;
                  }
                  else {
                    local_188 = (int *)malloc(sVar24);
                    if (local_188 == (int *)0x0) {
                      pcVar22 = "malloc send_node of REF_INT NULL";
                      uVar20 = 0x4e2;
                    }
                    else {
                      local_190 = (double *)malloc(sVar24);
                      if (local_190 != (double *)0x0) {
                        pvVar13 = malloc(sVar24);
                        if (pvVar13 == (void *)0x0) {
                          local_178 = (void *)0x0;
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x4e4,"ref_interp_tree","malloc my_proc of REF_INT NULL");
                          uVar9 = 2;
                        }
                        else {
                          local_178 = pvVar13;
                          if (uVar11 != 0) {
                            uVar17 = 0;
                            do {
                              *(REF_INT *)((long)pvVar13 + uVar17 * 4) = local_198->id;
                              uVar17 = uVar17 + 1;
                            } while (uVar11 != uVar17);
                          }
                        }
                        if (pvVar13 == (void *)0x0) {
                          return uVar9;
                        }
                        if (total_node < 1) {
                          RVar23 = 0;
                        }
                        else {
                          lVar18 = 0;
                          lVar19 = 0;
                          RVar23 = 0;
                          pRVar16 = local_170;
                          do {
                            if (local_198->id == pRVar16[lVar19]) {
                              lVar21 = (long)RVar23;
                              *(REF_INT *)((long)local_190 + lVar21 * 4) = source[lVar19];
                              uVar11 = *(uint *)((long)local_120 + lVar19 * 4);
                              local_188[lVar21] = uVar11;
                              cell = local_128[lVar19];
                              (&local_168->d)[lVar21] = cell;
                              if (cell == 0xffffffff) {
                                *local_118 = 1;
                              }
                              else {
                                uVar12 = ref_cell_nodes(local_d0,cell,nodes);
                                if (uVar12 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x4f0,"ref_interp_tree",(ulong)uVar12,
                                         "cell should be set and valid");
                                  printf("global %d best cell %d best bary %e\n",local_130[lVar19],
                                         (ulong)uVar11,(ulong)cell);
                                  return uVar12;
                                }
                                if (local_108->twod == 0) {
                                  uVar11 = ref_node_bary4(local_160,nodes,
                                                          (REF_DBL *)((long)global_xyz + lVar18),
                                                          (REF_DBL *)
                                                          ((long)local_180 + (long)(RVar23 * 4) * 8)
                                                         );
                                  if (uVar11 != 0) {
                                    uVar20 = 0x4f9;
                                    goto LAB_0015a2bc;
                                  }
                                }
                                else {
                                  *(undefined8 *)((long)local_180 + (long)(RVar23 * 4 + 3) * 8) = 0;
                                  uVar11 = ref_node_bary3(local_160,nodes,
                                                          (REF_DBL *)((long)global_xyz + lVar18),
                                                          (REF_DBL *)
                                                          ((long)local_180 + (long)(RVar23 * 4) * 8)
                                                         );
                                  if (uVar11 != 0) {
                                    uVar20 = 0x4f5;
LAB_0015a2bc:
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,uVar20,"ref_interp_tree",(ulong)uVar11,"bary");
                                    uVar9 = uVar11;
                                  }
                                }
                                if (uVar11 != 0) {
                                  return uVar9;
                                }
                              }
                              RVar23 = RVar23 + 1;
                              pRVar16 = local_170;
                            }
                            lVar19 = lVar19 + 1;
                            lVar18 = lVar18 + 0x18;
                          } while (lVar19 < total_node);
                        }
                        uVar11 = ref_mpi_blindsend(local_198,(REF_INT *)local_190,local_188,1,RVar23
                                                   ,&recv_node,&nrecv,1);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x504,"ref_interp_tree",(ulong)uVar11,"blind send node");
                          return uVar11;
                        }
                        uVar11 = ref_mpi_blindsend(local_198,(REF_INT *)local_190,local_168,1,RVar23
                                                   ,&recv_cell,&nrecv,1);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x507,"ref_interp_tree",(ulong)uVar11,"blind send cell");
                          return uVar11;
                        }
                        uVar11 = ref_mpi_blindsend(local_198,(REF_INT *)local_190,local_178,1,RVar23
                                                   ,&recv_proc,&nrecv,1);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x50a,"ref_interp_tree",(ulong)uVar11,"blind send proc");
                          return uVar11;
                        }
                        uVar11 = ref_mpi_blindsend(local_198,(REF_INT *)local_190,local_180,4,RVar23
                                                   ,&recv_bary,&nrecv,3);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x50d,"ref_interp_tree",(ulong)uVar11,"blind send bary");
                          return uVar11;
                        }
                        if (0 < nrecv) {
                          local_160 = (REF_NODE)0x0;
                          lVar18 = 0;
                          do {
                            local_1a0->n_tree = local_1a0->n_tree + 1;
                            node = recv_node[lVar18];
                            iVar1 = local_1a0->cell[node];
                            if ((long)iVar1 != -1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x512,"ref_interp_tree","tree already found?",
                                     0xffffffffffffffff,(long)iVar1);
                              uVar9 = 1;
                            }
                            if (iVar1 != -1) {
                              return uVar9;
                            }
                            if (local_1a0->agent_hired[node] != 0) {
                              uVar11 = ref_agents_delete(local_1a0->ref_agents,node);
                              if (uVar11 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x514,"ref_interp_tree",(ulong)uVar11,"deq");
                                return uVar11;
                              }
                              local_1a0->agent_hired[node] = 0;
                            }
                            local_1a0->cell[node] = recv_cell[lVar18];
                            local_1a0->part[node] = recv_proc[lVar18];
                            if (recv_cell[lVar18] == -1) {
                              local_1a0->n_tree = local_1a0->n_tree + -1;
                            }
                            else {
                              pRVar7 = local_1a0->bary;
                              lVar19 = 0;
                              do {
                                pRVar7[(node << 2) + lVar19] =
                                     *(REF_DBL *)((long)recv_bary + lVar19 * 8 + (long)local_160);
                                lVar19 = lVar19 + 1;
                              } while (lVar19 != 4);
                            }
                            lVar18 = lVar18 + 1;
                            local_160 = (REF_NODE)((long)local_160 + 0x20);
                          } while (lVar18 < nrecv);
                        }
                        uVar9 = ref_mpi_allsum(local_198,&local_1a0->n_tree,1,1);
                        if (uVar9 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x521,"ref_interp_tree",(ulong)uVar9,"as");
                          return uVar9;
                        }
                        uVar9 = ref_mpi_all_or(local_198,local_118);
                        if (uVar9 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x522,"ref_interp_tree",(ulong)uVar9,"sync status");
                          return uVar9;
                        }
                        if (recv_node != (REF_INT *)0x0) {
                          free(recv_node);
                        }
                        if (recv_cell != (REF_INT *)0x0) {
                          free(recv_cell);
                        }
                        if (recv_proc != (REF_INT *)0x0) {
                          free(recv_proc);
                        }
                        if (recv_bary != (REF_DBL *)0x0) {
                          free(recv_bary);
                        }
                        free(local_180);
                        if (local_178 != (void *)0x0) {
                          free(local_178);
                        }
                        free(local_168);
                        free(local_188);
                        free(local_190);
                        free(local_170);
                        free(local_128);
                        free(local_120);
                        free(local_130);
                        if (source != (REF_INT *)0x0) {
                          free(source);
                        }
                        if (global_node != (REF_INT *)0x0) {
                          free(global_node);
                        }
                        if (global_xyz != (REF_DBL *)0x0) {
                          free(global_xyz);
                        }
                        free(local_d8);
                        free(local_110);
                        uVar9 = ref_list_free(ref_list);
                        if (uVar9 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x53a,"ref_interp_tree",(ulong)uVar9,"free list");
                          return uVar9;
                        }
                        if (*local_118 != 0) {
                          return 0;
                        }
                        if ((long)local_148->max < 1) {
                          return 0;
                        }
                        lVar18 = 0;
                        while (((local_148->global[lVar18] < 0 ||
                                (local_148->ref_mpi->id != local_148->part[lVar18])) ||
                               (local_1a0->cell[lVar18] != -1))) {
                          lVar18 = lVar18 + 1;
                          if (local_148->max == lVar18) {
                            return 0;
                          }
                        }
                        pcVar22 = "node missed by tree";
                        uVar20 = 0x540;
                        goto LAB_00159a08;
                      }
                      pcVar22 = "malloc send_proc of REF_INT NULL";
                      uVar20 = 0x4e3;
                      local_190 = (double *)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar20
           ,"ref_interp_tree",pcVar22);
    RVar10 = 2;
  }
  return RVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_tree(REF_INTERP ref_interp,
                                          REF_BOOL *increase_fuzz) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *increase_fuzz = REF_FALSE;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(from_grid)) {
        RSS(ref_interp_enclosing_tri_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      }
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_cell, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        if (ref_grid_twod(from_grid)) {
          send_bary[3 + 4 * nsend] = 0.0;
          RSS(ref_node_bary3(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        } else {
          RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        }
      } else {
        *increase_fuzz =
            REF_TRUE; /* candidate not found, try again larger fuzz */
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");
  RSS(ref_mpi_all_or(ref_mpi, increase_fuzz), "sync status");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  if (!(*increase_fuzz)) {
    each_ref_node_valid_node(to_node, node) {
      if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
        continue;
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}